

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_atofp(u_char *line,size_t n,size_t point)

{
  byte bVar1;
  ngx_int_t nVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  
  nVar2 = -1;
  if (n != 0) {
    lVar4 = 0;
    lVar3 = 0;
    for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
      if (point == 0) {
        return -1;
      }
      bVar1 = line[sVar5];
      if ((ulong)bVar1 == 0x2e) {
        bVar6 = lVar3 != 0;
        lVar3 = 1;
        if (bVar6) {
          return -1;
        }
      }
      else {
        if ((byte)(bVar1 - 0x3a) < 0xf6) {
          return -1;
        }
        if (0xccccccccccccccb < lVar4) {
          if (lVar4 != 0xccccccccccccccc) {
            return -1;
          }
          if ((bVar1 & 8) != 0) {
            return -1;
          }
        }
        lVar4 = lVar4 * 10 + (ulong)bVar1 + -0x30;
        point = point - lVar3;
      }
    }
    for (; (bVar6 = point != 0, point = point - 1, nVar2 = lVar4, bVar6 &&
           (nVar2 = -1, lVar4 < 0xccccccccccccccd)); lVar4 = lVar4 * 10) {
    }
  }
  return nVar2;
}

Assistant:

ngx_int_t
ngx_atofp(u_char *line, size_t n, size_t point)
{
    ngx_int_t   value, cutoff, cutlim;
    ngx_uint_t  dot;

    if (n == 0) {
        return NGX_ERROR;
    }

    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;

    dot = 0;

    for (value = 0; n--; line++) {

        if (point == 0) {
            return NGX_ERROR;
        }

        if (*line == '.') {
            if (dot) {
                return NGX_ERROR;
            }

            dot = 1;
            continue;
        }

        if (*line < '0' || *line > '9') {
            return NGX_ERROR;
        }

        if (value >= cutoff && (value > cutoff || *line - '0' > cutlim)) {
            return NGX_ERROR;
        }

        value = value * 10 + (*line - '0');
        point -= dot;
    }

    while (point--) {
        if (value > cutoff) {
            return NGX_ERROR;
        }

        value = value * 10;
    }

    return value;
}